

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int set_non_blocking_mode(SOCKET sock)

{
  uint uVar1;
  int iVar2;
  int flags;
  SOCKET sock_local;
  
  uVar1 = fcntl64(sock,3,0);
  if ((int)uVar1 < 0) {
    flags = -1;
  }
  else {
    iVar2 = fcntl64(sock,4,uVar1 | 0x800);
    if (iVar2 < 0) {
      flags = -1;
    }
    else {
      flags = 0;
    }
  }
  return flags;
}

Assistant:

static int
set_non_blocking_mode(SOCKET sock)
{
	int flags = fcntl(sock, F_GETFL, 0);
	if (flags < 0) {
		return -1;
	}

	if (fcntl(sock, F_SETFL, (flags | O_NONBLOCK)) < 0) {
		return -1;
	}
	return 0;
}